

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O0

void __thiscall
MinVR::VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRGraphicsWindowNode>::
~VRConcreteItemFactory
          (VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRGraphicsWindowNode> *this)

{
  void *in_RDI;
  
  ~VRConcreteItemFactory
            ((VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRGraphicsWindowNode> *)0x12f788);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~VRConcreteItemFactory() {}